

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O3

List __thiscall xt::list::cons(list *this,List *list,Object *o)

{
  _List *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  List LVar3;
  shared_ptr<xt::_List> local_58;
  Object local_48;
  
  this_00 = (_List *)operator_new(0x38);
  Object::Object(&local_48,o);
  local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  peVar1 = local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
      peVar1 = (list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      (local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  _List::_List(this_00,&local_48,&local_58,peVar1->count + 1);
  *(_List **)this = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::_List*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),this_00);
  _Var2._M_pi = extraout_RDX;
  if (local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    _Var2._M_pi = extraout_RDX_00;
  }
  LVar3.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  LVar3.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (List)LVar3.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

List cons(List list, Object o) {
	return List(new _List {o, list, list->count+1});
}